

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O0

bool __thiscall storage::BTree::_search_(BTree *this,int key,Record **out)

{
  int iVar1;
  BTLeafNode *local_60;
  BTInnerNode *local_50;
  int local_34;
  BTNode *pBStack_30;
  int index;
  BTNode *node;
  Record **out_local;
  BTree *pBStack_18;
  int key_local;
  BTree *this_local;
  
  if (this->root_ == (BTNode *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    pBStack_30 = this->root_;
    node = (BTNode *)out;
    out_local._4_4_ = key;
    pBStack_18 = this;
    while( true ) {
      iVar1 = (**pBStack_30->_vptr_BTNode)();
      if ((((byte)iVar1 ^ 0xff) & 1) == 0) break;
      if (pBStack_30 == (BTNode *)0x0) {
        local_50 = (BTInnerNode *)0x0;
      }
      else {
        local_50 = (BTInnerNode *)
                   __dynamic_cast(pBStack_30,&BTNode::typeinfo,&BTInnerNode::typeinfo,0);
      }
      BTInnerNode::search_node(local_50,out_local._4_4_,&stack0xffffffffffffffd0);
    }
    local_34 = -1;
    if (pBStack_30 == (BTNode *)0x0) {
      local_60 = (BTLeafNode *)0x0;
    }
    else {
      local_60 = (BTLeafNode *)__dynamic_cast(pBStack_30,&BTNode::typeinfo,&BTLeafNode::typeinfo,0);
    }
    this_local._7_1_ =
         BTLeafNode::search_record(local_60,out_local._4_4_,&node->_vptr_BTNode,&local_34);
  }
  return this_local._7_1_;
}

Assistant:

bool BTree::_search_(int key, Record *&out) {
        if (!root_)
            return false;
        BTNode *node = root_;
        while (!node->is_leaf_node()) {
            dynamic_cast<BTInnerNode *>(node)->search_node(key, node);
        }
        int index = -1;
        return dynamic_cast<BTLeafNode *>(node)->search_record(key, out, index);
    }